

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_include_time(archive *_a,wchar_t flag,time_t sec,long nsec)

{
  wchar_t r;
  long nsec_local;
  time_t sec_local;
  wchar_t flag_local;
  archive *_a_local;
  
  _a_local._4_4_ = validate_time_flag(_a,flag,"archive_match_include_time");
  if (_a_local._4_4_ == L'\0') {
    _a_local._4_4_ = set_timefilter((archive_match *)_a,flag,sec,nsec,sec,nsec);
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_match_include_time(struct archive *_a, int flag, time_t sec,
    long nsec)
{
	int r;

	r = validate_time_flag(_a, flag, "archive_match_include_time");
	if (r != ARCHIVE_OK)
		return (r);
	return set_timefilter((struct archive_match *)_a, flag,
			sec, nsec, sec, nsec);
}